

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_primitive_service_interface
          (t_javame_generator *this,t_service *tservice)

{
  t_function *tfunction;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  t_service *ptVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar5;
  int __oflag;
  allocator local_3e9;
  string local_3e8;
  string local_3c8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_3a8;
  t_function **local_3a0;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_398;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_358;
  string local_338;
  string local_318 [32];
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator local_291;
  string local_290 [8];
  string extends_iface;
  string local_268 [32];
  undefined1 local_248 [8];
  ofstream_with_content_based_conditional_update f_iface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string f_interface_name;
  string local_38;
  t_service *local_18;
  t_service *tservice_local;
  t_javame_generator *this_local;
  
  local_18 = tservice;
  tservice_local = (t_service *)this;
  t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)&this->f_service_,(string *)&local_38);
  poVar2 = std::operator<<(poVar2,"public interface Iface extends ");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar2 = std::operator<<(poVar2,"Iface { }");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &f_iface.field_0x198,&this->package_dir_,"/");
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &f_iface.field_0x198,&(this->super_t_oop_generator).super_t_generator.service_name_
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,"Iface.java");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&f_iface.field_0x198);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_248);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_268,pcVar3,(allocator *)(extends_iface.field_2._M_local_buf + 0xf));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_248,(char *)local_268,__oflag);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)(extends_iface.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"",&local_291);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  ptVar4 = t_service::get_extends(local_18);
  if (ptVar4 != (t_service *)0x0) {
    ptVar4 = t_service::get_extends(local_18);
    type_name_abi_cxx11_(&local_2f8,this,&ptVar4->super_t_type,false,false,false);
    std::operator+(&local_2d8," extends ",&local_2f8);
    std::operator+(&local_2b8,&local_2d8,"Iface");
    std::__cxx11::string::operator=(local_290,(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_318);
  poVar2 = std::operator<<((ostream *)local_248,local_318);
  java_package_abi_cxx11_(&local_338,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_338);
  java_type_imports_abi_cxx11_(&local_358,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_358);
  java_thrift_imports_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this);
  std::operator<<(poVar2,(string *)
                         &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string(local_318);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])
            (this,local_248,local_18);
  poVar2 = std::operator<<((ostream *)local_248,"public interface ");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar2 = std::operator<<(poVar2,"Iface");
  poVar2 = std::operator<<(poVar2,local_290);
  poVar2 = std::operator<<(poVar2," {");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  __x = t_service::get_functions(local_18);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_398);
  local_3a0 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_398._M_current = local_3a0;
  while( true ) {
    local_3a8._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_398,&local_3a8);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_398);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
              (this,local_248,*pptVar5);
    poVar2 = std::operator<<((ostream *)local_248,"  public ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_398);
    tfunction = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e8,"",&local_3e9);
    function_signature(&local_3c8,this,tfunction,&local_3e8);
    poVar2 = std::operator<<(poVar2,(string *)&local_3c8);
    poVar2 = std::operator<<(poVar2,";");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_398);
  }
  poVar2 = std::operator<<((ostream *)local_248,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_290);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_248);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void t_javame_generator::generate_primitive_service_interface(t_service* tservice) {
  f_service_ << indent() << "public interface Iface extends " << service_name_ << "Iface { }"
             << endl << endl;

  string f_interface_name = package_dir_ + "/" + service_name_ + "Iface.java";
  ofstream_with_content_based_conditional_update f_iface;
  f_iface.open(f_interface_name.c_str());

  string extends_iface = "";
  if (tservice->get_extends() != nullptr) {
    extends_iface = " extends " + type_name(tservice->get_extends()) + "Iface";
  }

  f_iface << autogen_comment() << java_package() << java_type_imports() << java_thrift_imports();
  generate_java_doc(f_iface, tservice);
  f_iface << "public interface " << service_name_ << "Iface" << extends_iface << " {" << endl
          << endl;
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_iface, *f_iter);
    f_iface << "  public " << function_signature(*f_iter) << ";" << endl << endl;
  }
  f_iface << "}" << endl << endl;
}